

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

size_t readback_part(curl_mimepart *part,char *buffer,size_t bufsize,_Bool *hasread)

{
  mime_state *state;
  void **ppvVar1;
  char *__dest;
  size_t *psVar2;
  byte bVar3;
  char *pcVar4;
  size_t numbytes;
  size_t sVar5;
  curl_slist *pcVar6;
  size_t sVar7;
  _Bool _Var8;
  ulong __n;
  ulong uVar9;
  bool bVar10;
  size_t sStackY_80;
  char *local_60;
  size_t local_50;
  
  state = &part->state;
  ppvVar1 = &(part->state).ptr;
  __dest = (part->encstate).buf;
  sVar7 = 0;
LAB_0040dcc2:
  if (bufsize == 0) {
switchD_0040dce5_caseD_8:
    return sVar7;
  }
  sStackY_80 = 0;
  if (MIMESTATE_END < state->state) goto switchD_0040dce5_caseD_5;
  pcVar6 = (curl_slist *)*ppvVar1;
  switch(state->state) {
  case MIMESTATE_BEGIN:
    pcVar6 = part->curlheaders;
    (part->state).state = ((part->flags & 2) >> 1) * 3 + MIMESTATE_CURLHEADERS;
    (part->state).ptr = pcVar6;
LAB_0040df6b:
    (part->state).offset = 0;
    goto LAB_0040df73;
  case MIMESTATE_CURLHEADERS:
    if (pcVar6 == (curl_slist *)0x0) {
      pcVar6 = part->userheaders;
LAB_0040df59:
      (part->state).state = MIMESTATE_USERHEADERS;
      (part->state).ptr = pcVar6;
      goto LAB_0040df6b;
    }
LAB_0040ddac:
    pcVar4 = pcVar6->data;
    numbytes = strlen(pcVar4);
    sStackY_80 = readback_bytes(state,buffer,bufsize,pcVar4,numbytes,"\r\n",2);
    if (sStackY_80 == 0) {
      (part->state).ptr = pcVar6->next;
      (part->state).offset = 0;
      sStackY_80 = 0;
    }
    break;
  case MIMESTATE_USERHEADERS:
    if (pcVar6 != (curl_slist *)0x0) {
      pcVar4 = match_header(pcVar6,"Content-Type",0xc);
      if (pcVar4 != (char *)0x0) {
        pcVar6 = pcVar6->next;
        goto LAB_0040df59;
      }
      goto LAB_0040ddac;
    }
    state->state = MIMESTATE_EOH;
    goto LAB_0040df32;
  case MIMESTATE_EOH:
    sStackY_80 = readback_bytes(state,buffer,bufsize,"\r\n",2,"",0);
    if (sStackY_80 == 0) {
      state->state = MIMESTATE_BODY;
      *ppvVar1 = (void *)0x0;
      (part->state).offset = 0;
      sStackY_80 = 0;
    }
    break;
  case MIMESTATE_BODY:
    (part->encstate).bufend = 0;
    (part->encstate).pos = 0;
    (part->encstate).bufbeg = 0;
    state->state = MIMESTATE_CONTENT;
LAB_0040df32:
    *ppvVar1 = (void *)0x0;
    (part->state).offset = 0;
LAB_0040df73:
    sStackY_80 = 0;
    break;
  case MIMESTATE_CONTENT:
    if (part->encoder != (mime_encoder *)0x0) {
      sStackY_80 = 0;
      bVar3 = 0;
      local_60 = buffer;
      local_50 = bufsize;
      do {
        while( true ) {
          uVar9 = (part->encstate).bufbeg;
          bVar10 = uVar9 < (part->encstate).bufend;
          if (!(bool)(bVar10 | bVar3)) break;
          _Var8 = (_Bool)(!bVar10 | bVar3);
          sVar5 = (*part->encoder->encodefunc)(local_60,local_50,_Var8,part);
          if (sVar5 == 0) {
            if (_Var8 == false) {
              uVar9 = (part->encstate).bufbeg;
              break;
            }
            goto LAB_0040dfc7;
          }
          if (sVar5 + 2 < 2) goto LAB_0040df17;
          sStackY_80 = sStackY_80 + sVar5;
          local_60 = local_60 + sVar5;
          local_50 = local_50 - sVar5;
        }
        __n = (part->encstate).bufend;
        if (uVar9 != 0) {
          __n = __n - uVar9;
          if (__n != 0) {
            memmove(__dest,__dest + uVar9,__n);
          }
          (part->encstate).bufbeg = 0;
          (part->encstate).bufend = __n;
        }
        if (0xff < __n) {
          if (sStackY_80 != 0) goto LAB_0040dfc7;
          sStackY_80 = 0xffffffffffffffff;
          goto LAB_0040e030;
        }
        sVar5 = read_part_content(part,__dest + __n,0x100 - __n,hasread);
        if ((sVar5 + 2 < 2) || (sVar5 - 0x10000000 < 2)) goto LAB_0040df17;
        if (sVar5 == 0) {
          bVar3 = 1;
        }
        else {
          psVar2 = &(part->encstate).bufend;
          *psVar2 = *psVar2 + sVar5;
        }
      } while( true );
    }
    sStackY_80 = read_part_content(part,buffer,bufsize,hasread);
    goto LAB_0040dfc7;
  case MIMESTATE_END:
    goto switchD_0040dce5_caseD_8;
  }
switchD_0040dce5_caseD_5:
  sVar7 = sVar7 + sStackY_80;
  buffer = buffer + sStackY_80;
  bufsize = bufsize - sStackY_80;
  goto LAB_0040dcc2;
LAB_0040df17:
  if (sStackY_80 == 0) {
    sStackY_80 = sVar5;
  }
LAB_0040dfc7:
  if ((1 < sStackY_80 + 2) && (1 < sStackY_80 - 0x10000000)) {
    if (sStackY_80 != 0) goto switchD_0040dce5_caseD_5;
    (part->state).state = MIMESTATE_END;
    *ppvVar1 = (void *)0x0;
    (part->state).offset = 0;
    if ((part->kind == MIMEKIND_FILE) && ((FILE *)part->fp != (FILE *)0x0)) {
      fclose((FILE *)part->fp);
      part->fp = (FILE *)0x0;
    }
    sStackY_80 = 0;
  }
LAB_0040e030:
  if (sVar7 != 0) {
    return sVar7;
  }
  return sStackY_80;
}

Assistant:

static size_t readback_part(curl_mimepart *part,
                            char *buffer, size_t bufsize, bool *hasread)
{
  size_t cursize = 0;

  /* Readback from part. */

  while(bufsize) {
    size_t sz = 0;
    struct curl_slist *hdr = (struct curl_slist *) part->state.ptr;
    switch(part->state.state) {
    case MIMESTATE_BEGIN:
      mimesetstate(&part->state,
                   (part->flags & MIME_BODY_ONLY)?
                     MIMESTATE_BODY: MIMESTATE_CURLHEADERS,
                   part->curlheaders);
      break;
    case MIMESTATE_USERHEADERS:
      if(!hdr) {
        mimesetstate(&part->state, MIMESTATE_EOH, NULL);
        break;
      }
      if(match_header(hdr, "Content-Type", 12)) {
        mimesetstate(&part->state, MIMESTATE_USERHEADERS, hdr->next);
        break;
      }
      /* FALLTHROUGH */
    case MIMESTATE_CURLHEADERS:
      if(!hdr)
        mimesetstate(&part->state, MIMESTATE_USERHEADERS, part->userheaders);
      else {
        sz = readback_bytes(&part->state, buffer, bufsize,
                            hdr->data, strlen(hdr->data), STRCONST("\r\n"));
        if(!sz)
          mimesetstate(&part->state, part->state.state, hdr->next);
      }
      break;
    case MIMESTATE_EOH:
      sz = readback_bytes(&part->state, buffer, bufsize, STRCONST("\r\n"),
                          STRCONST(""));
      if(!sz)
        mimesetstate(&part->state, MIMESTATE_BODY, NULL);
      break;
    case MIMESTATE_BODY:
      cleanup_encoder_state(&part->encstate);
      mimesetstate(&part->state, MIMESTATE_CONTENT, NULL);
      break;
    case MIMESTATE_CONTENT:
      if(part->encoder)
        sz = read_encoded_part_content(part, buffer, bufsize, hasread);
      else
        sz = read_part_content(part, buffer, bufsize, hasread);
      switch(sz) {
      case 0:
        mimesetstate(&part->state, MIMESTATE_END, NULL);
        /* Try sparing open file descriptors. */
        if(part->kind == MIMEKIND_FILE && part->fp) {
          fclose(part->fp);
          part->fp = NULL;
        }
        /* FALLTHROUGH */
      case CURL_READFUNC_ABORT:
      case CURL_READFUNC_PAUSE:
      case READ_ERROR:
      case STOP_FILLING:
        return cursize? cursize: sz;
      }
      break;
    case MIMESTATE_END:
      return cursize;
    default:
      break;    /* Other values not in part state. */
    }

    /* Bump buffer and counters according to read size. */
    cursize += sz;
    buffer += sz;
    bufsize -= sz;
  }

  return cursize;
}